

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  Wlc_Obj_t *pWVar1;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar2;
  ulong uVar3;
  long lVar4;
  
  if (iObj != 0) {
    if ((iObj < 0) || ((p->vCopies).nSize <= iObj)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vCopies).pArray[(uint)iObj] == 0) {
      if (p->nObjsAlloc <= iObj) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((undefined1  [24])((undefined1  [24])p->pObjs[(uint)iObj] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x5) {
        pWVar1 = p->pObjs + (uint)iObj;
        uVar3 = (ulong)pWVar1->nFanins;
        if (0 < (int)pWVar1->nFanins) {
          lVar4 = 0;
          do {
            if ((2 < (uint)uVar3) ||
               (paVar2 = &pWVar1->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            Wlc_NtkDupDfs_rec(pNew,p,paVar2->Fanins[lVar4],vFanins);
            lVar4 = lVar4 + 1;
            uVar3 = (ulong)(int)pWVar1->nFanins;
          } while (lVar4 < (long)uVar3);
        }
        Wlc_ObjDup(pNew,p,iObj,vFanins);
        return;
      }
      __assert_fail("pObj->Type != WLC_OBJ_FF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                    ,0x3b7,"void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
  }
  return;
}

Assistant:

void Wlc_NtkDupDfs_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( iObj == 0 )
        return;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    //printf( "Visiting node %16s (ID %6d) of type %5s (type ID %2d)\n", Wlc_ObjName(p, iObj), iObj, Wlc_ObjTypeName(pObj), Wlc_NtkObj(p, iObj)->Type );
    assert( pObj->Type != WLC_OBJ_FF );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
    Wlc_ObjDup( pNew, p, iObj, vFanins );
}